

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O1

void __thiscall
OpenMD::ForceManager::selectedPostCalculation(ForceManager *this,Molecule *mol1,Molecule *mol2)

{
  pointer ppFVar1;
  Snapshot *this_00;
  double (*padVar2) [3];
  Mat3x3d *pMVar3;
  long lVar4;
  pointer ppRVar5;
  RigidBody *pRVar6;
  long lVar7;
  ForceModifier **forceModifier;
  pointer ppFVar8;
  Mat3x3d rbTau;
  double local_78 [9];
  
  ppFVar1 = (this->forceModifiers_).
            super__Vector_base<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar8 = (this->forceModifiers_).
                 super__Vector_base<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar8 != ppFVar1;
      ppFVar8 = ppFVar8 + 1) {
    (*(*ppFVar8)->_vptr_ForceModifier[2])();
  }
  ppRVar5 = (mol1->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar5 ==
      (mol1->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar6 = (RigidBody *)0x0;
  }
  else {
    pRVar6 = *ppRVar5;
  }
  this_00 = this->info_->sman_->currentSnapshot_;
  if (pRVar6 != (RigidBody *)0x0) {
    do {
      RigidBody::calcForcesAndTorquesAndVirial((Mat3x3d *)local_78,pRVar6);
      lVar4 = 0;
      padVar2 = (double (*) [3])local_78;
      pMVar3 = &this->virialTensor;
      do {
        lVar7 = 0;
        do {
          (pMVar3->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar7] =
               (((SquareMatrix<double,_3> *)*padVar2)->super_RectMatrix<double,_3U,_3U>).data_[0]
               [lVar7] + (pMVar3->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_[0][lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        lVar4 = lVar4 + 1;
        pMVar3 = (Mat3x3d *)
                 ((pMVar3->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                 );
        padVar2 = padVar2 + 1;
      } while (lVar4 != 3);
      ppRVar5 = ppRVar5 + 1;
      if (ppRVar5 ==
          (mol1->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pRVar6 = (RigidBody *)0x0;
      }
      else {
        pRVar6 = *ppRVar5;
      }
    } while (pRVar6 != (RigidBody *)0x0);
  }
  ppRVar5 = (mol2->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar5 ==
      (mol2->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar6 = (RigidBody *)0x0;
  }
  else {
    pRVar6 = *ppRVar5;
  }
  if (pRVar6 != (RigidBody *)0x0) {
    do {
      RigidBody::calcForcesAndTorquesAndVirial((Mat3x3d *)local_78,pRVar6);
      lVar4 = 0;
      padVar2 = (double (*) [3])local_78;
      pMVar3 = &this->virialTensor;
      do {
        lVar7 = 0;
        do {
          (pMVar3->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar7] =
               (((SquareMatrix<double,_3> *)*padVar2)->super_RectMatrix<double,_3U,_3U>).data_[0]
               [lVar7] + (pMVar3->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_[0][lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        lVar4 = lVar4 + 1;
        pMVar3 = (Mat3x3d *)
                 ((pMVar3->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                 );
        padVar2 = padVar2 + 1;
      } while (lVar4 != 3);
      ppRVar5 = ppRVar5 + 1;
      if (ppRVar5 ==
          (mol2->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pRVar6 = (RigidBody *)0x0;
      }
      else {
        pRVar6 = *ppRVar5;
      }
    } while (pRVar6 != (RigidBody *)0x0);
  }
  Snapshot::setVirialTensor(this_00,&this->virialTensor);
  return;
}

Assistant:

void ForceManager::selectedPostCalculation(Molecule* mol1, Molecule* mol2) {
    for (auto& forceModifier : forceModifiers_)
      forceModifier->modifyForces();

    // Modify the rigid bodies in response to the applied force
    // modifications
    SimInfo::MoleculeIterator mi;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;
    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();

    // Collect the atomic forces onto rigid bodies
    for (rb = mol1->beginRigidBody(rbIter); rb != NULL;
         rb = mol1->nextRigidBody(rbIter)) {
      Mat3x3d rbTau = rb->calcForcesAndTorquesAndVirial();
      virialTensor += rbTau;
    }

    for (rb = mol2->beginRigidBody(rbIter); rb != NULL;
         rb = mol2->nextRigidBody(rbIter)) {
      Mat3x3d rbTau = rb->calcForcesAndTorquesAndVirial();
      virialTensor += rbTau;
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, virialTensor.getArrayPointer(), 9, MPI_REALTYPE,
                  MPI_SUM, MPI_COMM_WORLD);
#endif
    curSnapshot->setVirialTensor(virialTensor);

    /*
      if (info_->getSimParams()->getUseLongRangeCorrections()) {

        RealType vol = curSnapshot->getVolume();
        RealType Elrc(0.0);
        RealType Wlrc(0.0);

        AtomTypeSet::iterator i;
        AtomTypeSet::iterator j;

        RealType n_i, n_j;
        RealType rho_i, rho_j;
        pair<RealType, RealType> LRI;

        for (i = atomTypes_.begin(); i != atomTypes_.end(); ++i) {
        n_i = RealType(info_->getGlobalCountOfType(*i));
        rho_i = n_i /  vol;
        for (j = atomTypes_.begin(); j != atomTypes_.end(); ++j) {
        n_j = RealType(info_->getGlobalCountOfType(*j));
        rho_j = n_j / vol;

        LRI = interactionMan_->getLongRangeIntegrals( (*i), (*j) );

        Elrc += n_i   * rho_j * LRI.first;
        Wlrc -= rho_i * rho_j * LRI.second;
        }
        }
        Elrc *= 2.0 * Constants::PI;
        Wlrc *= 2.0 * Constants::PI;

        RealType lrp = curSnapshot->getLongRangePotential();
        curSnapshot->setLongRangePotential(lrp + Elrc);
        virialTensor += Wlrc * SquareMatrix3<RealType>::identity();
        curSnapshot->setVirialTensor(virialTensor);
      }
    */
  }